

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_43(QPDF *pdf,char *arg2)

{
  reference pQVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  void *this;
  ostream *poVar5;
  ulong uVar6;
  allocator<char> local_681;
  string local_680 [39];
  allocator<char> local_659;
  string local_658 [32];
  QPDFObjectHandle local_638;
  string local_628 [39];
  allocator<char> local_601;
  string local_600 [39];
  allocator<char> local_5d9;
  string local_5d8 [32];
  QPDFObjectHandle local_5b8;
  string local_5a8 [32];
  string local_588 [8];
  string state;
  string local_548 [32];
  QPDFAnnotationObjectHelper local_528;
  QPDFFormFieldObjectHelper local_4f0;
  QPDFObjectHandle local_4b8;
  string local_4a8 [32];
  QPDFObjectHandle local_488;
  string local_478 [32];
  reference local_458;
  QPDFAnnotationObjectHelper *ah;
  iterator __end2_1;
  iterator __begin2_1;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> local_408 [24];
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *local_3f0;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *__range2_1;
  string local_3d8 [32];
  reference local_3b8;
  QPDFPageObjectHelper *page;
  iterator __end1_1;
  iterator __begin1_1;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_380 [24];
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *local_368;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1_1;
  string local_350 [32];
  reference local_330;
  QPDFAnnotationObjectHelper *aoh;
  iterator __end2;
  iterator __begin2;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *__range2;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> local_2d8 [8];
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> annotations;
  string local_2c0 [32];
  string local_2a0 [32];
  QPDFObjectHandle local_280;
  string local_270 [32];
  string local_250 [32];
  QPDFObjectHandle local_230;
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [39];
  byte local_159;
  QPDFObjectHandle local_158;
  byte local_142;
  allocator<char> local_141;
  string local_140 [32];
  undefined1 local_120 [8];
  QPDFFormFieldObjectHelper parent;
  QPDFFormFieldObjectHelper node;
  string local_a0 [32];
  reference local_80;
  QPDFFormFieldObjectHelper *ffh;
  iterator __end1;
  iterator __begin1;
  vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> *__range1;
  undefined1 local_38 [8];
  QPDFAcroFormDocumentHelper afdh;
  char *arg2_local;
  QPDF *pdf_local;
  
  afdh.m.super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper((QPDFAcroFormDocumentHelper *)local_38,pdf)
  ;
  bVar2 = QPDFAcroFormDocumentHelper::hasAcroForm();
  if ((bVar2 & 1) == 0) {
    std::operator<<((ostream *)&std::cout,"no forms\n");
  }
  else {
    std::operator<<((ostream *)&std::cout,"iterating over form fields\n");
    QPDFAcroFormDocumentHelper::getFormFields();
    __end1 = std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::
             begin((vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> *)
                   &__begin1);
    ffh = (QPDFFormFieldObjectHelper *)
          std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::end
                    ((vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>
                      *)&__begin1);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<QPDFFormFieldObjectHelper_*,_std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>_>
                                       *)&ffh), bVar3) {
      local_80 = __gnu_cxx::
                 __normal_iterator<QPDFFormFieldObjectHelper_*,_std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>_>
                 ::operator*(&__end1);
      poVar5 = std::operator<<((ostream *)&std::cout,"Field: ");
      QPDFObjectHelper::getObjectHandle
                ((QPDFObjectHelper *)
                 &node.m.
                  super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      QPDFObjectHandle::unparse_abi_cxx11_();
      poVar5 = std::operator<<(poVar5,local_a0);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_a0);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &node.m.
                  super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                ((QPDFFormFieldObjectHelper *)
                 &parent.m.
                  super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,local_80);
      while (bVar2 = QPDFFormFieldObjectHelper::isNull(), ((bVar2 ^ 0xff) & 1) != 0) {
        QPDFFormFieldObjectHelper::getParent();
        poVar5 = std::operator<<((ostream *)&std::cout,"  Parent: ");
        local_142 = 0;
        local_159 = 0;
        bVar2 = QPDFFormFieldObjectHelper::isNull();
        if ((bVar2 & 1) == 0) {
          QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)&local_158);
          local_159 = 1;
          QPDFObjectHandle::unparse_abi_cxx11_();
        }
        else {
          std::allocator<char>::allocator();
          local_142 = 1;
          std::__cxx11::string::string<std::allocator<char>>(local_140,"none",&local_141);
        }
        poVar5 = std::operator<<(poVar5,local_140);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_140);
        if ((local_159 & 1) != 0) {
          QPDFObjectHandle::~QPDFObjectHandle(&local_158);
        }
        if ((local_142 & 1) != 0) {
          std::allocator<char>::~allocator(&local_141);
        }
        QPDFFormFieldObjectHelper::operator=
                  ((QPDFFormFieldObjectHelper *)
                   &parent.m.
                    super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(QPDFFormFieldObjectHelper *)local_120);
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                  ((QPDFFormFieldObjectHelper *)local_120);
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"  Fully qualified name: ");
      QPDFFormFieldObjectHelper::getFullyQualifiedName_abi_cxx11_();
      poVar5 = std::operator<<(poVar5,local_180);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_180);
      poVar5 = std::operator<<((ostream *)&std::cout,"  Partial name: ");
      QPDFFormFieldObjectHelper::getPartialName_abi_cxx11_();
      poVar5 = std::operator<<(poVar5,local_1a0);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_1a0);
      poVar5 = std::operator<<((ostream *)&std::cout,"  Alternative name: ");
      QPDFFormFieldObjectHelper::getAlternativeName_abi_cxx11_();
      poVar5 = std::operator<<(poVar5,local_1c0);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_1c0);
      poVar5 = std::operator<<((ostream *)&std::cout,"  Mapping name: ");
      QPDFFormFieldObjectHelper::getMappingName_abi_cxx11_();
      poVar5 = std::operator<<(poVar5,local_1e0);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_1e0);
      poVar5 = std::operator<<((ostream *)&std::cout,"  Field type: ");
      QPDFFormFieldObjectHelper::getFieldType_abi_cxx11_();
      poVar5 = std::operator<<(poVar5,local_200);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_200);
      poVar5 = std::operator<<((ostream *)&std::cout,"  Value: ");
      QPDFFormFieldObjectHelper::getValue();
      QPDFObjectHandle::unparse_abi_cxx11_();
      poVar5 = std::operator<<(poVar5,local_220);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_220);
      QPDFObjectHandle::~QPDFObjectHandle(&local_230);
      poVar5 = std::operator<<((ostream *)&std::cout,"  Value as string: ");
      QPDFFormFieldObjectHelper::getValueAsString_abi_cxx11_();
      poVar5 = std::operator<<(poVar5,local_250);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_250);
      poVar5 = std::operator<<((ostream *)&std::cout,"  Default value: ");
      QPDFFormFieldObjectHelper::getDefaultValue();
      QPDFObjectHandle::unparse_abi_cxx11_();
      poVar5 = std::operator<<(poVar5,local_270);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_270);
      QPDFObjectHandle::~QPDFObjectHandle(&local_280);
      poVar5 = std::operator<<((ostream *)&std::cout,"  Default value as string: ");
      QPDFFormFieldObjectHelper::getDefaultValueAsString_abi_cxx11_();
      poVar5 = std::operator<<(poVar5,local_2a0);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_2a0);
      poVar5 = std::operator<<((ostream *)&std::cout,"  Default appearance: ");
      QPDFFormFieldObjectHelper::getDefaultAppearance_abi_cxx11_();
      poVar5 = std::operator<<(poVar5,local_2c0);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_2c0);
      poVar5 = std::operator<<((ostream *)&std::cout,"  Quadding: ");
      iVar4 = QPDFFormFieldObjectHelper::getQuadding();
      this = (void *)std::ostream::operator<<(poVar5,iVar4);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                ((QPDFFormFieldObjectHelper *)&__range2,local_80);
      QPDFAcroFormDocumentHelper::getAnnotationsForField((QPDFFormFieldObjectHelper *)local_2d8);
      QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper((QPDFFormFieldObjectHelper *)&__range2);
      __end2 = std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
               ::begin(local_2d8);
      aoh = (QPDFAnnotationObjectHelper *)
            std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::
            end(local_2d8);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
                                         *)&aoh), bVar3) {
        local_330 = __gnu_cxx::
                    __normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
                    ::operator*(&__end2);
        poVar5 = std::operator<<((ostream *)&std::cout,"  Annotation: ");
        QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)&__range1_1);
        QPDFObjectHandle::unparse_abi_cxx11_();
        poVar5 = std::operator<<(poVar5,local_350);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_350);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range1_1);
        __gnu_cxx::
        __normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
        ::operator++(&__end2);
      }
      std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
                (local_2d8);
      QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                ((QPDFFormFieldObjectHelper *)
                 &parent.m.
                  super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      __gnu_cxx::
      __normal_iterator<QPDFFormFieldObjectHelper_*,_std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>_>
      ::operator++(&__end1);
    }
    std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::~vector
              ((vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> *)
               &__begin1);
    std::operator<<((ostream *)&std::cout,"iterating over annotations per page\n");
    QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&__begin1_1,pdf);
    QPDFPageDocumentHelper::getAllPages();
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&__begin1_1);
    local_368 = local_380;
    __end1_1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin
                         (local_368);
    page = (QPDFPageObjectHelper *)
           std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end(local_368);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                               *)&page), bVar3) {
      local_3b8 = __gnu_cxx::
                  __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                  ::operator*(&__end1_1);
      poVar5 = std::operator<<((ostream *)&std::cout,"Page: ");
      QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)&__range2_1);
      QPDFObjectHandle::unparse_abi_cxx11_();
      poVar5 = std::operator<<(poVar5,local_3d8);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_3d8);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range2_1);
      QPDFPageObjectHelper::QPDFPageObjectHelper((QPDFPageObjectHelper *)&__begin2_1,local_3b8);
      QPDFAcroFormDocumentHelper::getWidgetAnnotationsForPage((QPDFPageObjectHelper *)local_408);
      QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)&__begin2_1);
      local_3f0 = local_408;
      __end2_1 = std::
                 vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::
                 begin(local_3f0);
      ah = (QPDFAnnotationObjectHelper *)
           std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::end
                     (local_3f0);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
                                 *)&ah), bVar3) {
        local_458 = __gnu_cxx::
                    __normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
                    ::operator*(&__end2_1);
        poVar5 = std::operator<<((ostream *)&std::cout,"  Annotation: ");
        QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)&local_488);
        QPDFObjectHandle::unparse_abi_cxx11_();
        poVar5 = std::operator<<(poVar5,local_478);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_478);
        QPDFObjectHandle::~QPDFObjectHandle(&local_488);
        poVar5 = std::operator<<((ostream *)&std::cout,"    Field: ");
        QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper(&local_528,local_458);
        QPDFAcroFormDocumentHelper::getFieldForAnnotation((QPDFAnnotationObjectHelper *)&local_4f0);
        QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)&local_4b8);
        QPDFObjectHandle::unparse_abi_cxx11_();
        poVar5 = std::operator<<(poVar5,local_4a8);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_4a8);
        QPDFObjectHandle::~QPDFObjectHandle(&local_4b8);
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_4f0);
        QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_528);
        poVar5 = std::operator<<((ostream *)&std::cout,"    Subtype: ");
        QPDFAnnotationObjectHelper::getSubtype_abi_cxx11_();
        poVar5 = std::operator<<(poVar5,local_548);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_548);
        std::operator<<((ostream *)&std::cout,"    Rect: ");
        QPDFAnnotationObjectHelper::getRect();
        print_rect((ostream *)&std::cout,(Rectangle *)((long)&state.field_2 + 8));
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        QPDFAnnotationObjectHelper::getAppearanceState_abi_cxx11_();
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          poVar5 = std::operator<<((ostream *)&std::cout,"    Appearance state: ");
          poVar5 = std::operator<<(poVar5,local_588);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        poVar5 = std::operator<<((ostream *)&std::cout,"    Appearance stream (/N): ");
        pQVar1 = local_458;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_5d8,"/N",&local_5d9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_600,"",&local_601);
        QPDFAnnotationObjectHelper::getAppearanceStream((string *)&local_5b8,(string *)pQVar1);
        QPDFObjectHandle::unparse_abi_cxx11_();
        poVar5 = std::operator<<(poVar5,local_5a8);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_5a8);
        QPDFObjectHandle::~QPDFObjectHandle(&local_5b8);
        std::__cxx11::string::~string(local_600);
        std::allocator<char>::~allocator(&local_601);
        std::__cxx11::string::~string(local_5d8);
        std::allocator<char>::~allocator(&local_5d9);
        poVar5 = std::operator<<((ostream *)&std::cout,"    Appearance stream (/N, /3): ");
        pQVar1 = local_458;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_658,"/N",&local_659);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_680,"/3",&local_681);
        QPDFAnnotationObjectHelper::getAppearanceStream((string *)&local_638,(string *)pQVar1);
        QPDFObjectHandle::unparse_abi_cxx11_();
        poVar5 = std::operator<<(poVar5,local_628);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_628);
        QPDFObjectHandle::~QPDFObjectHandle(&local_638);
        std::__cxx11::string::~string(local_680);
        std::allocator<char>::~allocator(&local_681);
        std::__cxx11::string::~string(local_658);
        std::allocator<char>::~allocator(&local_659);
        std::__cxx11::string::~string(local_588);
        __gnu_cxx::
        __normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
        ::operator++(&__end2_1);
      }
      std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
                (local_408);
      __gnu_cxx::
      __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
      ::operator++(&__end1_1);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(local_380);
  }
  QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper((QPDFAcroFormDocumentHelper *)local_38);
  return;
}

Assistant:

static void
test_43(QPDF& pdf, char const* arg2)
{
    // Forms
    QPDFAcroFormDocumentHelper afdh(pdf);
    if (!afdh.hasAcroForm()) {
        std::cout << "no forms\n";
        return;
    }
    std::cout << "iterating over form fields\n";
    for (auto& ffh: afdh.getFormFields()) {
        std::cout << "Field: " << ffh.getObjectHandle().unparse() << std::endl;
        QPDFFormFieldObjectHelper node = ffh;
        while (!node.isNull()) {
            QPDFFormFieldObjectHelper parent(node.getParent());
            std::cout << "  Parent: "
                      << (parent.isNull() ? std::string("none")
                                          : parent.getObjectHandle().unparse())
                      << std::endl;
            node = parent;
        }
        std::cout << "  Fully qualified name: " << ffh.getFullyQualifiedName() << std::endl;
        std::cout << "  Partial name: " << ffh.getPartialName() << std::endl;
        std::cout << "  Alternative name: " << ffh.getAlternativeName() << std::endl;
        std::cout << "  Mapping name: " << ffh.getMappingName() << std::endl;
        std::cout << "  Field type: " << ffh.getFieldType() << std::endl;
        std::cout << "  Value: " << ffh.getValue().unparse() << std::endl;
        std::cout << "  Value as string: " << ffh.getValueAsString() << std::endl;
        std::cout << "  Default value: " << ffh.getDefaultValue().unparse() << std::endl;
        std::cout << "  Default value as string: " << ffh.getDefaultValueAsString() << std::endl;
        std::cout << "  Default appearance: " << ffh.getDefaultAppearance() << std::endl;
        std::cout << "  Quadding: " << ffh.getQuadding() << std::endl;
        std::vector<QPDFAnnotationObjectHelper> annotations = afdh.getAnnotationsForField(ffh);
        for (auto& aoh: annotations) {
            std::cout << "  Annotation: " << aoh.getObjectHandle().unparse() << std::endl;
        }
    }
    std::cout << "iterating over annotations per page\n";
    for (auto& page: QPDFPageDocumentHelper(pdf).getAllPages()) {
        std::cout << "Page: " << page.getObjectHandle().unparse() << std::endl;
        for (auto& ah: afdh.getWidgetAnnotationsForPage(page)) {
            std::cout << "  Annotation: " << ah.getObjectHandle().unparse() << std::endl;
            std::cout << "    Field: "
                      << (afdh.getFieldForAnnotation(ah).getObjectHandle().unparse()) << std::endl;
            std::cout << "    Subtype: " << ah.getSubtype() << std::endl;
            std::cout << "    Rect: ";
            print_rect(std::cout, ah.getRect());
            std::cout << std::endl;
            std::string state = ah.getAppearanceState();
            if (!state.empty()) {
                std::cout << "    Appearance state: " << state << std::endl;
            }
            std::cout << "    Appearance stream (/N): " << ah.getAppearanceStream("/N").unparse()
                      << std::endl;
            std::cout << "    Appearance stream (/N, /3): "
                      << ah.getAppearanceStream("/N", "/3").unparse() << std::endl;
        }
    }
}